

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::InsertUnique(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  void **ppvVar1;
  bool bVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  LogFinisher local_a1;
  Node *local_a0;
  InnerMap *local_98;
  ulong local_90;
  LogMessage local_68;
  
  if ((this->index_of_first_non_null_ != this->num_buckets_) &&
     (this->table_[this->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x326);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr: "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap
  ::FindHelper<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>,_unsigned_long>
              *)&local_68,this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node,
             (TreeIterator *)0x0);
  if (local_68._0_8_ != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x32c);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: find(node->kv.first) == end(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  ppvVar1 = this->table_;
  if (ppvVar1[b] == (void *)0x0) {
    node->next = (Node *)0x0;
    ppvVar1[b] = node;
    local_98 = this;
  }
  else {
    if (ppvVar1[b] == ppvVar1[b ^ 1]) {
      InsertUniqueInTree(__return_storage_ptr__,this,b,node);
      return __return_storage_ptr__;
    }
    bVar2 = TableEntryIsTooLong(this,b);
    if (!bVar2) {
      InsertUniqueInList(__return_storage_ptr__,this,b,node);
      return __return_storage_ptr__;
    }
    TreeConvert(this,b);
    InsertUniqueInTree((iterator *)&local_a0,this,b,node);
    uVar4 = b & 0xfffffffffffffffe;
    node = local_a0;
    b = local_90;
    if (local_90 != uVar4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x333);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&local_a0,
                          "CHECK failed: (result.bucket_index_) == (b & ~static_cast<size_type>(1)): "
                         );
      internal::LogFinisher::operator=(&local_a1,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&local_a0);
    }
  }
  uVar4 = this->index_of_first_non_null_;
  if (b < this->index_of_first_non_null_) {
    uVar4 = b;
  }
  this->index_of_first_non_null_ = uVar4;
  __return_storage_ptr__->node_ = node;
  __return_storage_ptr__->m_ = local_98;
  __return_storage_ptr__->bucket_index_ = b;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != nullptr);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(node->kv.first) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (PROTOBUF_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }